

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size,HuffmanCode *table,uint32_t *opt_table_size,
               BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint16_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  byte *pbVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  long lVar12;
  sbyte sVar13;
  uint uVar14;
  uint uVar15;
  uint32_t uVar16;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint32_t uVar23;
  uint16_t *puVar24;
  uint64_t uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint local_54;
  
  if (BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS < s->substate_huffman) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  uVar18 = alphabet_size & 0x3ff;
  switch(s->substate_huffman) {
  case BROTLI_STATE_HUFFMAN_NONE:
    uVar11 = (s->br).bit_pos_;
    if (uVar11 - 0x3f < 2) {
      sVar17 = (s->br).avail_in;
      if (sVar17 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar20 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      (s->br).val_ = uVar20 >> 8;
      uVar25 = (ulong)*pbVar6 << 0x38 | uVar20 >> 8;
      (s->br).val_ = uVar25;
      uVar11 = uVar11 - 8;
      (s->br).avail_in = sVar17 - 1;
      (s->br).next_in = pbVar6 + 1;
    }
    else {
      uVar25 = br->val_;
    }
    uVar22 = (uint)(uVar25 >> ((byte)uVar11 & 0x3f)) & 3;
    s->sub_loop_counter = uVar22;
    uVar11 = uVar11 + 2;
    (s->br).bit_pos_ = uVar11;
    if (uVar22 != 1) {
      s->repeat = 0;
      s->space = 0x20;
      s->code_length_code_lengths[0] = '\0';
      s->code_length_code_lengths[1] = '\0';
      s->code_length_code_lengths[2] = '\0';
      s->code_length_code_lengths[3] = '\0';
      s->code_length_code_lengths[4] = '\0';
      s->code_length_code_lengths[5] = '\0';
      s->code_length_code_lengths[6] = '\0';
      s->code_length_code_lengths[7] = '\0';
      s->code_length_code_lengths[8] = '\0';
      s->code_length_code_lengths[9] = '\0';
      s->code_length_code_lengths[10] = '\0';
      s->code_length_code_lengths[0xb] = '\0';
      s->code_length_code_lengths[0xc] = '\0';
      s->code_length_code_lengths[0xd] = '\0';
      s->code_length_code_lengths[0xe] = '\0';
      s->code_length_code_lengths[0xf] = '\0';
      *(undefined1 (*) [16])(s->code_length_code_lengths + 0xe) = (undefined1  [16])0x0;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      uVar23 = 0x20;
      uVar11 = 0;
LAB_001030a7:
      uVar20 = (ulong)uVar22;
      uVar16 = (s->br).bit_pos_;
      do {
        bVar3 = "\x01\x02\x03\x04"[uVar20];
        if (uVar16 - 0x3d < 4) {
          sVar17 = (s->br).avail_in;
          if (sVar17 != 0) {
            uVar26 = (s->br).val_;
            pbVar6 = (s->br).next_in;
            (s->br).val_ = uVar26 >> 8;
            uVar25 = (ulong)*pbVar6 << 0x38 | uVar26 >> 8;
            (s->br).val_ = uVar25;
            uVar16 = uVar16 - 8;
            (s->br).avail_in = sVar17 - 1;
            (s->br).next_in = pbVar6 + 1;
            goto LAB_0010311f;
          }
          if (uVar16 - 0x40 == 0) {
            uVar26 = 0;
          }
          else {
            uVar26 = br->val_ >> ((byte)uVar16 & 0x3f);
          }
          uVar22 = (uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar26];
          if (-(uVar16 - 0x40) < uVar22) {
            s->sub_loop_counter = (uint32_t)uVar20;
            s->repeat = uVar11;
            s->space = uVar23;
            s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
        }
        else {
          uVar25 = br->val_;
LAB_0010311f:
          uVar26 = (ulong)((uint)(uVar25 >> ((byte)uVar16 & 0x3f)) & 0xf);
          uVar22 = (uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar26];
        }
        uVar16 = uVar22 + uVar16;
        bVar2 = ""[uVar26];
        (s->br).bit_pos_ = uVar16;
        s->code_length_code_lengths[bVar3] = bVar2;
        if ((0x1111UL >> (uVar26 & 0x3f) & 1) == 0) {
          s->code_length_histo[bVar2] = s->code_length_histo[bVar2] + 1;
          uVar23 = uVar23 - (0x20U >> (bVar2 & 0x1f));
          uVar11 = uVar11 + 1;
          if (uVar23 - 0x21 < 0xffffffe0) break;
        }
        uVar20 = uVar20 + 1;
      } while ((int)uVar20 != 0x12);
      goto LAB_00102b82;
    }
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
    uVar11 = (s->br).bit_pos_;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    uVar11 = s->sub_loop_counter;
    uVar22 = s->symbol;
    goto LAB_00102f57;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    uVar22 = s->symbol;
    goto LAB_00102c74;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    uVar22 = s->sub_loop_counter;
    uVar11 = s->repeat;
    uVar23 = s->space;
    if (uVar22 < 0x12) goto LAB_001030a7;
LAB_00102b82:
    if ((uVar11 != 1) && (uVar23 != 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    }
    BrotliBuildCodeLengthsHuffmanTable(s->table,s->code_length_code_lengths,s->code_length_histo);
    s->code_length_histo[8] = 0;
    s->code_length_histo[9] = 0;
    s->code_length_histo[10] = 0;
    s->code_length_histo[0xb] = 0;
    s->code_length_histo[0xc] = 0;
    s->code_length_histo[0xd] = 0;
    s->code_length_histo[0xe] = 0;
    s->code_length_histo[0xf] = 0;
    s->code_length_histo[0] = 0;
    auVar8 = _DAT_001091d0;
    auVar7 = _DAT_001091c0;
    s->code_length_histo[1] = 0;
    s->code_length_histo[2] = 0;
    s->code_length_histo[3] = 0;
    s->code_length_histo[4] = 0;
    s->code_length_histo[5] = 0;
    s->code_length_histo[6] = 0;
    s->code_length_histo[7] = 0;
    puVar24 = s->symbol_lists;
    lVar12 = 0;
    do {
      auVar27._8_4_ = (int)lVar12;
      auVar27._0_8_ = lVar12;
      auVar27._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar28 = packssdw(auVar27 | auVar8,auVar27 | auVar7);
      *(undefined1 (*) [16])(s->next_symbol + lVar12) = auVar28;
      puVar1 = puVar24 + SUB168(auVar27 | auVar8,0);
      puVar1[0] = 0xffff;
      puVar1[1] = 0xffff;
      puVar1[2] = 0xffff;
      puVar1[3] = 0xffff;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
    s->symbol = 0;
    s->repeat = 0;
    s->repeat_code_len = 0;
    s->prev_code_len = 8;
    s->space = 0x8000;
    s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    uVar16 = 0x8000;
    local_54 = 8;
    uVar22 = 0;
    uVar23 = 0;
    uVar11 = 0;
    goto LAB_00102d0b;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar11 = s->symbol;
    uVar23 = s->repeat;
    uVar16 = s->space;
    uVar22 = s->repeat_code_len;
    local_54 = s->prev_code_len;
    puVar24 = s->symbol_lists;
LAB_00102d0b:
    iVar9 = BrotliWarmupBitReader(br);
    if (iVar9 == 0) {
      uVar16 = s->space;
      uVar11 = s->symbol;
joined_r0x00103236:
      if (uVar11 < uVar18) {
        if (uVar16 == 0) goto LAB_00103440;
        uVar23 = (s->br).bit_pos_;
        uVar22 = 0;
        if (uVar23 != 0x40) {
          uVar22 = (uint)(br->val_ >> ((byte)uVar23 & 0x3f));
        }
        bVar3 = s->table[uVar22 & 0x1f].bits;
        if (0x40 - uVar23 < (uint)bVar3) {
LAB_0010327a:
          sVar17 = (s->br).avail_in;
          if (sVar17 == 0) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar20 = (s->br).val_;
          pbVar6 = (s->br).next_in;
          (s->br).val_ = uVar20 >> 8;
          (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar20 >> 8;
          (s->br).bit_pos_ = uVar23 - 8;
          (s->br).avail_in = sVar17 - 1;
          (s->br).next_in = pbVar6 + 1;
        }
        else {
          uVar4 = s->table[uVar22 & 0x1f].value;
          if (uVar4 < 0x10) {
            (s->br).bit_pos_ = uVar23 + bVar3;
            s->repeat = 0;
            uVar22 = (uint)uVar4;
            if (uVar22 != 0) {
              s->symbol_lists[s->next_symbol[uVar22]] = (uint16_t)uVar11;
              s->next_symbol[uVar22] = uVar11;
              s->prev_code_len = uVar22;
              uVar16 = uVar16 - (0x8000U >> ((byte)uVar4 & 0x1f));
              s->space = uVar16;
              s->code_length_histo[uVar22] = s->code_length_histo[uVar22] + 1;
            }
            uVar11 = uVar11 + 1;
            s->symbol = uVar11;
          }
          else {
            uVar14 = ((uint)uVar4 + (uint)bVar3) - 0xe;
            if (0x40 - uVar23 < uVar14) goto LAB_0010327a;
            uVar22 = uVar22 >> (bVar3 & 0x1f) & kBitMask[uVar4 - 0xe];
            (s->br).bit_pos_ = uVar14 + uVar23;
            if (uVar4 == 0x10) {
              uVar14 = s->prev_code_len;
              sVar13 = 2;
            }
            else {
              uVar14 = 0;
              sVar13 = 3;
            }
            if (s->repeat_code_len == uVar14) {
              uVar23 = s->repeat;
              if (uVar23 == 0) goto LAB_00103396;
              iVar9 = uVar23 - 2 << sVar13;
            }
            else {
              s->repeat_code_len = uVar14;
LAB_00103396:
              iVar9 = 0;
              uVar23 = 0;
            }
            puVar24 = s->symbol_lists;
            uVar10 = uVar22 + iVar9 + 3;
            s->repeat = uVar10;
            iVar21 = uVar10 - uVar23;
            uVar15 = iVar21 + uVar11;
            if (uVar18 < uVar15) {
              s->symbol = uVar18;
              s->space = 0xfffff;
              return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
            }
            if (uVar14 == 0) {
              s->symbol = uVar15;
              uVar11 = uVar15;
            }
            else {
              iVar9 = ((iVar9 + uVar22) - uVar23) + 3;
              uVar22 = s->next_symbol[uVar14];
              do {
                uVar19 = uVar11;
                puVar24[(int)uVar22] = (uint16_t)uVar19;
                iVar9 = iVar9 + -1;
                uVar11 = uVar19 + 1;
                uVar22 = uVar19;
              } while (iVar9 != 0);
              s->symbol = uVar15;
              s->next_symbol[uVar14] = uVar19;
              uVar16 = uVar16 - (iVar21 << (0xfU - (char)uVar14 & 0x1f));
              s->space = uVar16;
              s->code_length_histo[uVar14] = s->code_length_histo[uVar14] + (short)iVar21;
              uVar11 = uVar15;
            }
          }
        }
        goto joined_r0x00103236;
      }
    }
    else {
      if (uVar16 != 0 && uVar11 < uVar18) {
        sVar17 = (s->br).avail_in;
        do {
          if (sVar17 < 4) {
            s->symbol = uVar11;
            s->repeat = uVar23;
            s->prev_code_len = local_54;
            s->repeat_code_len = uVar22;
            s->space = uVar16;
            goto joined_r0x00103236;
          }
          uVar14 = (s->br).bit_pos_;
          uVar20 = (s->br).val_;
          if (0x1f < uVar14) {
            uVar14 = uVar14 ^ 0x20;
            (s->br).bit_pos_ = uVar14;
            puVar5 = (uint *)(s->br).next_in;
            uVar20 = uVar20 >> 0x20 | (ulong)*puVar5 << 0x20;
            (s->br).val_ = uVar20;
            sVar17 = sVar17 - 4;
            (s->br).avail_in = sVar17;
            (s->br).next_in = (uint8_t *)(puVar5 + 1);
          }
          uVar15 = (uint)(uVar20 >> ((byte)uVar14 & 0x3f)) & 0x1f;
          uVar10 = s->table[uVar15].bits + uVar14;
          (s->br).bit_pos_ = uVar10;
          uVar4 = s->table[uVar15].value;
          if (uVar4 < 0x10) {
            uVar14 = (uint)uVar4;
            if (uVar14 != 0) {
              puVar24[s->next_symbol[uVar14]] = (uint16_t)uVar11;
              s->next_symbol[uVar14] = uVar11;
              uVar16 = uVar16 - (0x8000U >> ((byte)uVar4 & 0x1f));
              s->code_length_histo[uVar14] = s->code_length_histo[uVar14] + 1;
              local_54 = uVar14;
            }
            uVar11 = uVar11 + 1;
            uVar23 = 0;
          }
          else {
            iVar9 = 0;
            uVar14 = 0;
            if (uVar4 == 0x10) {
              uVar14 = local_54;
            }
            uVar15 = uVar4 == 0x10 ^ 3;
            uVar19 = (uint)(uVar20 >> ((byte)uVar10 & 0x3f)) & kBitMask[uVar15];
            (s->br).bit_pos_ = uVar10 + uVar15;
            if ((uVar22 == uVar14) && (uVar14 = uVar22, uVar23 != 0)) {
              iVar9 = uVar23 - 2 << (sbyte)uVar15;
            }
            else {
              uVar23 = 0;
            }
            uVar10 = uVar19 + iVar9 + 3;
            iVar21 = uVar10 - uVar23;
            uVar15 = iVar21 + uVar11;
            if (uVar18 < uVar15) {
              uVar16 = 0xfffff;
              break;
            }
            if (uVar14 == 0) {
              uVar22 = 0;
              uVar11 = uVar15;
              uVar23 = uVar10;
            }
            else {
              iVar9 = ((iVar9 + uVar19) - uVar23) + 3;
              uVar22 = s->next_symbol[uVar14];
              do {
                uVar19 = uVar11;
                puVar24[(int)uVar22] = (uint16_t)uVar19;
                iVar9 = iVar9 + -1;
                uVar11 = uVar19 + 1;
                uVar22 = uVar19;
              } while (iVar9 != 0);
              s->next_symbol[uVar14] = uVar19;
              s->code_length_histo[uVar14] = s->code_length_histo[uVar14] + (short)iVar21;
              uVar16 = uVar16 - (iVar21 << (0xfU - (char)uVar14 & 0x1f));
              uVar11 = uVar15;
              uVar23 = uVar10;
              uVar22 = uVar14;
            }
          }
          if ((uVar18 <= uVar11) || (uVar16 == 0)) break;
        } while( true );
      }
      s->space = uVar16;
    }
    if (uVar16 != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
LAB_00103440:
    uVar11 = BrotliBuildHuffmanTable(table,8,s->symbol_lists,s->code_length_histo);
    if (opt_table_size != (uint32_t *)0x0) {
      *opt_table_size = uVar11;
    }
    goto LAB_00103469;
  }
  if (uVar11 - 0x3f < 2) {
    sVar17 = (s->br).avail_in;
    if (sVar17 == 0) {
      s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    uVar20 = (s->br).val_;
    pbVar6 = (s->br).next_in;
    (s->br).val_ = uVar20 >> 8;
    uVar20 = (ulong)*pbVar6 << 0x38 | uVar20 >> 8;
    (s->br).val_ = uVar20;
    uVar11 = uVar11 - 8;
    (s->br).avail_in = sVar17 - 1;
    (s->br).next_in = pbVar6 + 1;
  }
  else {
    uVar20 = br->val_;
  }
  uVar22 = (uint)(uVar20 >> ((byte)uVar11 & 0x3f)) & 3;
  s->symbol = uVar22;
  (s->br).bit_pos_ = uVar11 + 2;
  s->sub_loop_counter = 0;
  uVar11 = 0;
LAB_00102f57:
  uVar15 = uVar18 - 1;
  uVar14 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar14 = (uVar14 ^ 0xffffffe0) + 0x21;
  if (uVar15 == 0) {
    uVar14 = 0;
  }
  if (uVar11 <= uVar22) {
    uVar23 = (s->br).bit_pos_;
    do {
      uVar15 = 0x40 - uVar23;
      if (uVar15 < uVar14) {
        sVar17 = (s->br).avail_in;
        do {
          sVar17 = sVar17 - 1;
          if (sVar17 == 0xffffffffffffffff) {
            s->sub_loop_counter = uVar11;
            s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar20 = (s->br).val_;
          pbVar6 = (s->br).next_in;
          (s->br).val_ = uVar20 >> 8;
          uVar25 = (ulong)*pbVar6 << 0x38 | uVar20 >> 8;
          (s->br).val_ = uVar25;
          uVar23 = uVar23 - 8;
          (s->br).bit_pos_ = uVar23;
          (s->br).avail_in = sVar17;
          (s->br).next_in = pbVar6 + 1;
          uVar15 = uVar15 + 8;
        } while (uVar15 < uVar14);
      }
      else {
        uVar25 = br->val_;
      }
      uVar15 = (uint)(uVar25 >> ((byte)uVar23 & 0x3f)) & kBitMask[uVar14];
      uVar23 = uVar23 + uVar14;
      (s->br).bit_pos_ = uVar23;
      if (uVar18 <= uVar15) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
      }
      s->symbols_lists_array[uVar11] = (uint16_t)uVar15;
      uVar11 = uVar11 + 1;
    } while (uVar11 <= uVar22);
  }
  if (uVar22 == 0) {
    uVar22 = 0;
  }
  else {
    uVar20 = 0;
    do {
      puVar24 = s->symbols_lists_array + uVar20;
      uVar20 = uVar20 + 1;
      uVar26 = uVar20 & 0xffffffff;
      do {
        if (*puVar24 == s->symbols_lists_array[uVar26]) {
          return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
        }
        uVar18 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar18;
      } while (uVar18 <= uVar22);
    } while (uVar20 != uVar22);
LAB_00102c74:
    if (uVar22 == 3) {
      uVar18 = (s->br).bit_pos_;
      uVar20 = (ulong)uVar18;
      if (uVar18 == 0x40) {
        sVar17 = (s->br).avail_in;
        if (sVar17 == 0) {
          s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar20 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        (s->br).val_ = uVar20 >> 8;
        uVar25 = (ulong)*pbVar6 << 0x38 | uVar20 >> 8;
        (s->br).val_ = uVar25;
        (s->br).avail_in = sVar17 - 1;
        (s->br).next_in = pbVar6 + 1;
        uVar20 = 0x38;
      }
      else {
        uVar25 = br->val_;
      }
      (s->br).bit_pos_ = (int)uVar20 + 1;
      uVar22 = ((uVar25 >> (uVar20 & 0x3f) & 1) != 0) + 3;
      s->symbol = uVar22;
    }
  }
  uVar11 = BrotliBuildSimpleHuffmanTable(table,8,s->symbols_lists_array,uVar22);
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar11;
  }
LAB_00103469:
  s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  /* Unnecessary masking, but might be good for safety. */
  alphabet_size &= 0x3ff;
  /* State machine */
  switch (s->substate_huffman) {
    case BROTLI_STATE_HUFFMAN_NONE:
      if (!BrotliSafeReadBits(br, 2, &s->sub_loop_counter)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      BROTLI_LOG_UINT(s->sub_loop_counter);
      /* The value is used as follows:
         1 for simple code;
         0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
      if (s->sub_loop_counter != 1) {
        s->space = 32;
        s->repeat = 0; /* num_codes */
        memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo[0]) *
            (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
        memset(&s->code_length_code_lengths[0], 0,
            sizeof(s->code_length_code_lengths));
        s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
        goto Complex;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      /* Read symbols, codes & code lengths directly. */
      if (!BrotliSafeReadBits(br, 2, &s->symbol)) { /* num_symbols */
        s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->sub_loop_counter = 0;
      /* No break, transit to the next state. */
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
      BrotliDecoderErrorCode result =
          ReadSimpleHuffmanSymbols(alphabet_size, s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
      uint32_t table_size;
      if (s->symbol == 3) {
        uint32_t bits;
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->symbol += bits;
      }
      BROTLI_LOG_UINT(s->symbol);
      table_size = BrotliBuildSimpleHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbols_lists_array, s->symbol);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

Complex: /* Decode Huffman-coded code lengths. */
    case BROTLI_STATE_HUFFMAN_COMPLEX: {
      uint32_t i;
      BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      BrotliBuildCodeLengthsHuffmanTable(s->table,
                                         s->code_length_code_lengths,
                                         s->code_length_histo);
      memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo));
      for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
        s->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
        s->symbol_lists[(int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1)] = 0xFFFF;
      }

      s->symbol = 0;
      s->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
      s->repeat = 0;
      s->repeat_code_len = 0;
      s->space = 32768;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
      uint32_t table_size;
      BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size, s);
      if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
        result = SafeReadSymbolCodeLengths(alphabet_size, s);
      }
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }

      if (s->space != 0) {
        BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", s->space));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
      }
      table_size = BrotliBuildHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbol_lists, s->code_length_histo);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}